

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundReferenceExpression::Deserialize
          (BoundReferenceExpression *this,Deserializer *deserializer)

{
  unsigned_long index;
  BoundReferenceExpression *this_00;
  LogicalType return_type;
  LogicalType local_38;
  
  Deserializer::ReadProperty<duckdb::LogicalType>(&return_type,deserializer,200,"return_type");
  index = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,0xc9,"index");
  this_00 = (BoundReferenceExpression *)operator_new(0x60);
  LogicalType::LogicalType(&local_38,&return_type);
  BoundReferenceExpression(this_00,&local_38,index);
  LogicalType::~LogicalType(&local_38);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  LogicalType::~LogicalType(&return_type);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundReferenceExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto index = deserializer.ReadPropertyWithDefault<idx_t>(201, "index");
	auto result = duckdb::unique_ptr<BoundReferenceExpression>(new BoundReferenceExpression(std::move(return_type), index));
	return std::move(result);
}